

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

RenderBox * __thiscall
Rml::Element::GetRenderBox
          (RenderBox *__return_storage_ptr__,Element *this,BoxArea fill_area,int index)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  pointer pPVar5;
  ElementMeta *pEVar6;
  code *pcVar7;
  Vector2f VVar8;
  bool bVar9;
  BoxArea area;
  pointer this_00;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector2f local_58;
  float local_48;
  float fStack_44;
  
  if ((2 < fill_area - Border) &&
     (bVar9 = Assert("Render box can only be generated with fill area of border, padding or content."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x1f7), !bVar9)) {
LAB_0021a8fc:
    pcVar7 = (code *)invalidInstructionException();
    (*pcVar7)();
  }
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if ((index < 1) ||
     (pPVar5 = (this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->additional_boxes).
                         super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5) >> 6) < index))
  {
    this_00 = (pointer)&this->main_box;
    local_58 = this->rounded_main_padding_size;
    local_48 = 0.0;
    fStack_44 = 0.0;
  }
  else {
    this_00 = pPVar5 + ((ulong)(uint)index - 1);
    local_58 = Box::GetSize(&this_00->box,Padding);
    local_48 = Math::Round(pPVar5[(ulong)(uint)index - 1].offset.x);
    fStack_44 = Math::Round(pPVar5[(ulong)(uint)index - 1].offset.y);
  }
  fVar13 = 0.0;
  fVar14 = 0.0;
  fVar11 = 0.0;
  fVar12 = 0.0;
  if (1 < (int)fill_area) {
    fVar11 = 0.0;
    fVar12 = 0.0;
    area = Border;
    fVar13 = 0.0;
    fVar14 = 0.0;
    do {
      fVar10 = Box::GetEdge(&this_00->box,area,Top);
      fVar11 = fVar10 + fVar11;
      fVar10 = Box::GetEdge(&this_00->box,area,Right);
      fVar12 = fVar12 + fVar10;
      fVar10 = Box::GetEdge(&this_00->box,area,Bottom);
      fVar13 = fVar10 + fVar13;
      fVar10 = Box::GetEdge(&this_00->box,area,Left);
      fVar14 = fVar14 + fVar10;
      area = area + Border;
    } while (fill_area != area);
  }
  switch(fill_area) {
  case Margin:
  case Auto:
    bVar9 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x219);
    local_58.x = 0.0;
    local_58.y = 0.0;
    if (!bVar9) goto LAB_0021a8fc;
    break;
  case Border:
    VVar8 = Box::GetFrameSize(&this_00->box,Border);
    local_58.x = local_58.x + VVar8.x;
    local_58.y = local_58.y + VVar8.y;
    break;
  case Padding:
    break;
  case Content:
    VVar8 = Box::GetFrameSize(&this_00->box,Padding);
    local_58.x = local_58.x - VVar8.x;
    local_58.y = local_58.y - VVar8.y;
    break;
  default:
    local_58.x = 0.0;
    local_58.y = 0.0;
  }
  pEVar6 = this->meta;
  sVar1 = (pEVar6->computed_values).rare.border_top_left_radius;
  sVar2 = (pEVar6->computed_values).rare.border_top_right_radius;
  sVar3 = (pEVar6->computed_values).rare.border_bottom_right_radius;
  sVar4 = (pEVar6->computed_values).rare.border_bottom_left_radius;
  (__return_storage_ptr__->fill_size).x = local_58.x;
  (__return_storage_ptr__->fill_size).y = local_58.y;
  (__return_storage_ptr__->border_offset).x = local_48;
  (__return_storage_ptr__->border_offset).y = fStack_44;
  (__return_storage_ptr__->border_widths)._M_elems[0] = fVar11;
  (__return_storage_ptr__->border_widths)._M_elems[1] = fVar12;
  (__return_storage_ptr__->border_widths)._M_elems[2] = fVar13;
  (__return_storage_ptr__->border_widths)._M_elems[3] = fVar14;
  (__return_storage_ptr__->border_radius)._M_elems[0] = (float)(int)sVar1;
  (__return_storage_ptr__->border_radius)._M_elems[1] = (float)(int)sVar2;
  (__return_storage_ptr__->border_radius)._M_elems[2] = (float)(int)sVar3;
  (__return_storage_ptr__->border_radius)._M_elems[3] = (float)(int)sVar4;
  return __return_storage_ptr__;
}

Assistant:

RenderBox Element::GetRenderBox(BoxArea fill_area, int index)
{
	RMLUI_ASSERTMSG(fill_area >= BoxArea::Border && fill_area <= BoxArea::Content,
		"Render box can only be generated with fill area of border, padding or content.");

	UpdateAbsoluteOffsetAndRenderBoxData();

	struct BoxReference {
		const Box& box;
		Vector2f padding_size;
		Vector2f offset;
	};
	auto GetBoxAndOffset = [this, index]() {
		const int additional_box_index = index - 1;
		if (index < 1 || additional_box_index >= (int)additional_boxes.size())
			return BoxReference{main_box, rounded_main_padding_size, {}};
		const PositionedBox& positioned_box = additional_boxes[additional_box_index];
		return BoxReference{positioned_box.box, positioned_box.box.GetSize(BoxArea::Padding), positioned_box.offset.Round()};
	};

	BoxReference box = GetBoxAndOffset();

	EdgeSizes edge_sizes = {};
	for (int area = (int)BoxArea::Border; area < (int)fill_area; area++)
	{
		edge_sizes[0] += box.box.GetEdge(BoxArea(area), BoxEdge::Top);
		edge_sizes[1] += box.box.GetEdge(BoxArea(area), BoxEdge::Right);
		edge_sizes[2] += box.box.GetEdge(BoxArea(area), BoxEdge::Bottom);
		edge_sizes[3] += box.box.GetEdge(BoxArea(area), BoxEdge::Left);
	}
	Vector2f inner_size;
	switch (fill_area)
	{
	case BoxArea::Border: inner_size = box.padding_size + box.box.GetFrameSize(BoxArea::Border); break;
	case BoxArea::Padding: inner_size = box.padding_size; break;
	case BoxArea::Content: inner_size = box.padding_size - box.box.GetFrameSize(BoxArea::Padding); break;
	case BoxArea::Margin:
	case BoxArea::Auto: RMLUI_ERROR;
	}

	return RenderBox{inner_size, box.offset, edge_sizes, meta->computed_values.border_radius()};
}